

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O3

int xmlTextWriterEndDTDElement(xmlTextWriterPtr writer)

{
  int iVar1;
  int iVar2;
  xmlLinkPtr lk;
  void *pvVar3;
  
  iVar2 = -1;
  if ((((writer != (xmlTextWriterPtr)0x0) &&
       (lk = xmlListFront(writer->nodes), lk != (xmlLinkPtr)0x0)) &&
      (pvVar3 = xmlLinkGetData(lk), pvVar3 != (void *)0x0)) &&
     ((*(int *)((long)pvVar3 + 8) - 9U < 2 &&
      (iVar1 = xmlOutputBufferWriteString(writer->out,">"), -1 < iVar1)))) {
    if (writer->indent != 0) {
      iVar2 = xmlOutputBufferWriteString(writer->out,"\n");
      if (iVar2 < 0) {
        return -1;
      }
      iVar1 = iVar2 + iVar1;
    }
    xmlListPopFront(writer->nodes);
    iVar2 = iVar1;
  }
  return iVar2;
}

Assistant:

int
xmlTextWriterEndDTDElement(xmlTextWriterPtr writer)
{
    int count;
    int sum;
    xmlLinkPtr lk;
    xmlTextWriterStackEntry *p;

    if (writer == NULL)
        return -1;

    sum = 0;
    lk = xmlListFront(writer->nodes);
    if (lk == 0)
        return -1;

    p = (xmlTextWriterStackEntry *) xmlLinkGetData(lk);
    if (p == 0)
        return -1;

    switch (p->state) {
        case XML_TEXTWRITER_DTD_ELEM:
        case XML_TEXTWRITER_DTD_ELEM_TEXT:
            count = xmlOutputBufferWriteString(writer->out, ">");
            if (count < 0)
                return -1;
            sum += count;
            break;
        default:
            return -1;
    }

    if (writer->indent) {
        count = xmlOutputBufferWriteString(writer->out, "\n");
        if (count < 0)
            return -1;
        sum += count;
    }

    xmlListPopFront(writer->nodes);
    return sum;
}